

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O1

size_t ZSTD_estimateCStreamSize_usingCParams(ZSTD_compressionParameters cParams)

{
  size_t sVar1;
  size_t sVar2;
  int in_stack_00000020;
  ZSTD_CCtx_params initialParams;
  ZSTD_compressionParameters in_stack_ffffffffffffff30;
  
  ZSTD_makeCCtxParamsFromCParams(in_stack_ffffffffffffff30);
  if (in_stack_00000020 - 6U < 0xfffffffd) {
    sVar1 = ZSTD_estimateCStreamSize_usingCCtxParams((ZSTD_CCtx_params *)&stack0xffffffffffffff20);
  }
  else {
    sVar2 = ZSTD_estimateCStreamSize_usingCCtxParams((ZSTD_CCtx_params *)&stack0xffffffffffffff20);
    sVar1 = ZSTD_estimateCStreamSize_usingCCtxParams((ZSTD_CCtx_params *)&stack0xffffffffffffff20);
    if (sVar1 < sVar2) {
      sVar1 = sVar2;
    }
  }
  return sVar1;
}

Assistant:

size_t ZSTD_estimateCStreamSize_usingCParams(ZSTD_compressionParameters cParams)
{
    ZSTD_CCtx_params initialParams = ZSTD_makeCCtxParamsFromCParams(cParams);
    if (ZSTD_rowMatchFinderSupported(cParams.strategy)) {
        /* Pick bigger of not using and using row-based matchfinder for greedy and lazy strategies */
        size_t noRowCCtxSize;
        size_t rowCCtxSize;
        initialParams.useRowMatchFinder = ZSTD_ps_disable;
        noRowCCtxSize = ZSTD_estimateCStreamSize_usingCCtxParams(&initialParams);
        initialParams.useRowMatchFinder = ZSTD_ps_enable;
        rowCCtxSize = ZSTD_estimateCStreamSize_usingCCtxParams(&initialParams);
        return MAX(noRowCCtxSize, rowCCtxSize);
    } else {
        return ZSTD_estimateCStreamSize_usingCCtxParams(&initialParams);
    }
}